

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O1

bool vkt::texture::anon_unknown_0::verifyTexCompareResult<tcu::Texture2DArray>
               (TestContext *testCtx,ConstPixelBufferAccess *result,Texture2DArray *src,
               float *texCoord,ReferenceParams *sampleParams,TexComparePrecision *comparePrec,
               LodPrecision *lodPrec,PixelFormat *pixelFormat)

{
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppAVar2;
  ChannelType CVar3;
  TestLog *this_00;
  int i;
  int iVar4;
  long lVar5;
  Surface *pSVar6;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  long lVar7;
  ChannelOrder CVar8;
  long lVar9;
  undefined1 local_320 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  string local_2f8;
  float *local_2d8;
  ReferenceParams *local_2d0;
  Surface reference;
  string local_2b0;
  Surface errorMask;
  string local_278;
  Vec3 nonShadowThreshold;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [6];
  Texture2DArray clampedSource;
  ios_base local_138 [264];
  
  this_00 = testCtx->m_log;
  local_2d8 = texCoord;
  local_2d0 = sampleParams;
  tcu::Surface::Surface(&reference,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  tcu::Surface::Surface(&errorMask,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  local_320._0_4_ = pixelFormat->redBits;
  local_320._4_4_ = pixelFormat->greenBits;
  local_320._8_4_ = pixelFormat->blueBits;
  local_320._12_4_ = pixelFormat->alphaBits;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar5 = 0;
  do {
    res.m_data[lVar5] = *(int *)(local_320 + lVar5 * 4) + -1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  tcu::computeFixedPointThreshold((tcu *)&clampedSource,&res);
  nonShadowThreshold.m_data[2] =
       clampedSource.super_TextureLevelPyramid.m_data.
       super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  CVar8 = (src->super_TextureLevelPyramid).m_format.order;
  CVar3 = (src->super_TextureLevelPyramid).m_format.type;
  if ((CVar3 == FLOAT && CVar8 == D) || (CVar3 == FLOAT_UNSIGNED_INT_24_8_REV && CVar8 == DS)) {
    tcu::Texture2DArray::Texture2DArray(&clampedSource,src);
    if (0 < (int)((ulong)((long)clampedSource.super_TextureLevelPyramid.m_access.
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)clampedSource.super_TextureLevelPyramid.m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
      lVar7 = 8;
      lVar5 = 0;
      lVar9 = 0;
      do {
        if (*(long *)(CONCAT44(clampedSource.super_TextureLevelPyramid.m_data.
                               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               clampedSource.super_TextureLevelPyramid.m_data.
                               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar7) != 0) {
          clampFloatingPointTexture
                    ((PixelBufferAccess *)
                     ((long)((clampedSource.super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_ConstPixelBufferAccess).m_size.m_data + lVar5 + -8));
        }
        lVar9 = lVar9 + 1;
        lVar5 = lVar5 + 0x28;
        lVar7 = lVar7 + 0x10;
      } while (lVar9 < (int)((ulong)((long)clampedSource.super_TextureLevelPyramid.m_access.
                                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)clampedSource.super_TextureLevelPyramid.m_access.
                                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x33333333);
    }
    tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)&res,&reference,pixelFormat);
    local_320._0_4_ = clampedSource.m_view.m_numLevels;
    local_320._8_8_ = clampedSource.m_view.m_levels;
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)&res,(Texture2DArrayView *)local_320,local_2d8,local_2d0);
    local_320._0_4_ = RGBA;
    local_320._4_4_ = UNORM_INT8;
    if (reference.m_pixels.m_cap != 0) {
      reference.m_pixels.m_cap = (size_t)reference.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res,(TextureFormat *)local_320,reference.m_width,
               reference.m_height,1,(void *)reference.m_pixels.m_cap);
    local_2f8._M_dataplus._M_p = (pointer)0x300000008;
    if (errorMask.m_pixels.m_cap != 0) {
      errorMask.m_pixels.m_cap = (size_t)errorMask.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_320,(TextureFormat *)&local_2f8,errorMask.m_width,
               errorMask.m_height,1,(void *)errorMask.m_pixels.m_cap);
    local_2f8._M_dataplus._M_p._0_4_ = clampedSource.m_view.m_numLevels;
    local_2f8._M_string_length = (size_type)clampedSource.m_view.m_levels;
    iVar4 = glu::TextureTestUtil::computeTextureCompareDiff
                      (result,(ConstPixelBufferAccess *)&res,(PixelBufferAccess *)local_320,
                       (Texture2DArrayView *)&local_2f8,local_2d8,local_2d0,comparePrec,lodPrec,
                       &nonShadowThreshold);
    tcu::Texture3D::~Texture3D((Texture3D *)&clampedSource);
  }
  else {
    tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)&clampedSource,&reference,pixelFormat);
    res.m_data._8_8_ = (src->m_view).m_levels;
    res.m_data[0] = (src->m_view).m_numLevels;
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)&clampedSource,(Texture2DArrayView *)&res,local_2d8,local_2d0);
    res.m_data[0] = 8;
    res.m_data[1] = 3;
    if (reference.m_pixels.m_cap != 0) {
      reference.m_pixels.m_cap = (size_t)reference.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&clampedSource,(TextureFormat *)&res,reference.m_width,
               reference.m_height,1,(void *)reference.m_pixels.m_cap);
    local_320._0_4_ = RGBA;
    local_320._4_4_ = UNORM_INT8;
    if (errorMask.m_pixels.m_cap != 0) {
      errorMask.m_pixels.m_cap = (size_t)errorMask.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res,(TextureFormat *)local_320,errorMask.m_width,
               errorMask.m_height,1,(void *)errorMask.m_pixels.m_cap);
    local_320._8_8_ = (src->m_view).m_levels;
    local_320._0_4_ = (src->m_view).m_numLevels;
    iVar4 = glu::TextureTestUtil::computeTextureCompareDiff
                      (result,(ConstPixelBufferAccess *)&clampedSource,(PixelBufferAccess *)&res,
                       (Texture2DArrayView *)local_320,local_2d8,local_2d0,comparePrec,lodPrec,
                       &nonShadowThreshold);
  }
  CVar8 = (ChannelOrder)this_00;
  if (0 < iVar4) {
    this = &clampedSource.super_TextureLevelPyramid.m_data;
    clampedSource.super_TextureLevelPyramid.m_format.type = (ChannelType)((ulong)this_00 >> 0x20);
    clampedSource.super_TextureLevelPyramid.m_format.order = CVar8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"ERROR: Result verification failed, got ",0x27);
    std::ostream::operator<<(this,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," invalid pixels!",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&clampedSource,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    std::ios_base::~ios_base(local_138);
  }
  local_320._0_8_ = &local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"VerifyResult","");
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&res,(string *)local_320,&local_2f8);
  tcu::TestLog::startImageSet(this_00,(char *)res.m_data._0_8_,local_228._M_p);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Rendered","");
  paVar1 = &local_278.field_2;
  local_278._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Rendered image","");
  tcu::LogImage::LogImage
            ((LogImage *)&clampedSource,&local_2b0,&local_278,result,QP_IMAGE_COMPRESSION_MODE_BEST)
  ;
  tcu::LogImage::write((LogImage *)&clampedSource,CVar8,__buf,(size_t)result);
  if (clampedSource.super_TextureLevelPyramid.m_access.
      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&clampedSource.super_TextureLevelPyramid.m_access.
                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(clampedSource.super_TextureLevelPyramid.m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((clampedSource.super_TextureLevelPyramid.m_access.
                                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   super_ConstPixelBufferAccess).m_format.order + 1));
  }
  ppAVar2 = &clampedSource.super_TextureLevelPyramid.m_data.
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if ((pointer *)
      CONCAT44(clampedSource.super_TextureLevelPyramid.m_format.type,
               clampedSource.super_TextureLevelPyramid.m_format.order) != ppAVar2) {
    operator_delete((undefined1 *)
                    CONCAT44(clampedSource.super_TextureLevelPyramid.m_format.type,
                             clampedSource.super_TextureLevelPyramid.m_format.order),
                    (ulong)((long)&(clampedSource.super_TextureLevelPyramid.m_data.
                                    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->m_ptr + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_p != local_218) {
    operator_delete(local_228._M_p,local_218[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._0_8_ != &local_238) {
    operator_delete((void *)res.m_data._0_8_,local_238._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._0_8_ != &local_310) {
    operator_delete((void *)local_320._0_8_,local_310._M_allocated_capacity + 1);
  }
  if (0 < iVar4) {
    local_320._0_8_ = &local_310;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Reference","");
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Ideal reference image","")
    ;
    pSVar6 = &reference;
    tcu::LogImage::LogImage
              ((LogImage *)&clampedSource,(string *)local_320,&local_2f8,pSVar6,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&clampedSource,CVar8,__buf_00,(size_t)pSVar6);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"ErrorMask","");
    local_278._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Error mask","");
    pSVar6 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&res,&local_2b0,&local_278,pSVar6,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&res,CVar8,__buf_01,(size_t)pSVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_p != local_218) {
      operator_delete(local_228._M_p,local_218[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res.m_data._0_8_ != &local_238) {
      operator_delete((void *)res.m_data._0_8_,local_238._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar1) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (clampedSource.super_TextureLevelPyramid.m_access.
        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)&clampedSource.super_TextureLevelPyramid.m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(clampedSource.super_TextureLevelPyramid.m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((clampedSource.super_TextureLevelPyramid.m_access.
                                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super_ConstPixelBufferAccess).m_format.order + 1));
    }
    if ((pointer *)
        CONCAT44(clampedSource.super_TextureLevelPyramid.m_format.type,
                 clampedSource.super_TextureLevelPyramid.m_format.order) != ppAVar2) {
      operator_delete((undefined1 *)
                      CONCAT44(clampedSource.super_TextureLevelPyramid.m_format.type,
                               clampedSource.super_TextureLevelPyramid.m_format.order),
                      (ulong)((long)&(clampedSource.super_TextureLevelPyramid.m_data.
                                      super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->m_ptr + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._0_8_ != &local_310) {
      operator_delete((void *)local_320._0_8_,local_310._M_allocated_capacity + 1);
    }
  }
  tcu::TestLog::endImageSet(this_00);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&reference);
  return iVar4 == 0;
}

Assistant:

bool verifyTexCompareResult (tcu::TestContext&						testCtx,
							 const tcu::ConstPixelBufferAccess&		result,
							 const TextureType&						src,
							 const float*							texCoord,
							 const ReferenceParams&					sampleParams,
							 const tcu::TexComparePrecision&		comparePrec,
							 const tcu::LodPrecision&				lodPrec,
							 const tcu::PixelFormat&				pixelFormat)
{
	tcu::TestLog&	log					= testCtx.getLog();
	tcu::Surface	reference			(result.getWidth(), result.getHeight());
	tcu::Surface	errorMask			(result.getWidth(), result.getHeight());
	const tcu::Vec3	nonShadowThreshold	= tcu::computeFixedPointThreshold(getBitsVec(pixelFormat)-1).swizzle(1,2,3);
	int				numFailedPixels;

	// sampleTexture() expects source image to be the same state as it would be in a GL implementation, that is
	// the floating point depth values should be in [0, 1] range as data is clamped during texture upload. Since
	// we don't have a separate "uploading" phase and just reuse the buffer we used for GL-upload, do the clamping
	// here if necessary.

	if (isFloatingPointDepthFormat(src.getFormat()))
	{
		TextureType clampedSource(src);

		clampFloatingPointTexture(clampedSource);

		// sample clamped values

		sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), clampedSource, texCoord, sampleParams);
		numFailedPixels = computeTextureCompareDiff(result, reference.getAccess(), errorMask.getAccess(), clampedSource, texCoord, sampleParams, comparePrec, lodPrec, nonShadowThreshold);
	}
	else
	{
		// sample raw values (they are guaranteed to be in [0, 1] range as the format cannot represent any other values)

		sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), src, texCoord, sampleParams);
		numFailedPixels = computeTextureCompareDiff(result, reference.getAccess(), errorMask.getAccess(), src, texCoord, sampleParams, comparePrec, lodPrec, nonShadowThreshold);
	}

	if (numFailedPixels > 0)
		log << TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

	log << TestLog::ImageSet("VerifyResult", "Verification result")
		<< TestLog::Image("Rendered", "Rendered image", result);

	if (numFailedPixels > 0)
	{
		log << TestLog::Image("Reference", "Ideal reference image", reference)
			<< TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << TestLog::EndImageSet;

	return numFailedPixels == 0;
}